

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::Instance,_embree::InstancePrimitive>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  atomic<unsigned_long> *paVar1;
  long *plVar2;
  atomic<int> *paVar3;
  int iVar4;
  uint uVar5;
  Geometry *pGVar6;
  BVH *pBVar7;
  value_type this_01;
  BuildRef *pBVar8;
  MutexSys *pMVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  value_type this_02;
  undefined1 *puVar12;
  undefined8 *puVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  Geometry *geometry;
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  Lock<embree::MutexSys> lock;
  MutexSys *local_e0;
  mvector<PrimRef> local_d8;
  RefBuilderSmall *local_b0;
  long *local_a8;
  Lock<embree::MutexSys> local_a0;
  value_type local_90;
  PrimInfo pinfo;
  
  sVar17 = this->objectID_;
  pGVar6 = (topBuilder->scene->geometries).items[sVar17].ptr;
  if (pGVar6 == (Geometry *)0x0) {
    geometry = (Geometry *)0x0;
  }
  else {
    geometry = (Geometry *)0x0;
    if (0x1d < ((uint)pGVar6->field_8 & 0xfe)) {
      geometry = pGVar6;
    }
  }
  uVar5 = geometry->numPrimitives;
  uVar16 = (ulong)uVar5;
  lVar18 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_d8.alloc.device = (MemoryMonitorInterface *)(lVar18 + 0x550);
  if (lVar18 == 0) {
    local_d8.alloc.device = (MemoryMonitorInterface *)0x0;
  }
  local_d8.items = (PrimRef *)0x0;
  local_d8.alloc.hugepages = false;
  local_d8.size_active = 0;
  local_d8.size_alloced = 0;
  local_b0 = this;
  if (uVar16 != 0) {
    sVar17 = uVar16 << 5;
    (**(local_d8.alloc.device)->_vptr_MemoryMonitorInterface)(local_d8.alloc.device,sVar17,0);
    if (uVar5 < 0xe0000) {
      local_d8.items = (PrimRef *)alignedMalloc(sVar17,0x20);
    }
    else {
      local_d8.items = (PrimRef *)os_malloc(sVar17,&local_d8.alloc.hugepages);
    }
    sVar17 = local_b0->objectID_;
    local_d8.size_alloced = uVar16;
  }
  local_d8.size_active = local_d8.size_alloced;
  avx::createPrimRefArray
            (&pinfo,geometry,(uint)sVar17,uVar16,&local_d8,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  lVar18 = 0xc;
  local_a8 = (long *)__tls_get_addr();
  uVar16 = 0;
  do {
    sVar17 = local_d8.size_alloced;
    if (pinfo.end - pinfo.begin <= uVar16) {
      if (local_d8.items != (PrimRef *)0x0) {
        if (local_d8.size_alloced << 5 < 0x1c00000) {
          alignedFree(local_d8.items);
        }
        else {
          os_free(local_d8.items,local_d8.size_alloced << 5,local_d8.alloc.hugepages);
        }
      }
      if (sVar17 != 0) {
        (**(local_d8.alloc.device)->_vptr_MemoryMonitorInterface)
                  (local_d8.alloc.device,sVar17 * -0x20,1);
      }
      return;
    }
    pBVar7 = topBuilder->bvh;
    this_02 = (value_type)*local_a8;
    if (this_02 == (value_type)0x0) {
      this_02 = (value_type)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys((MutexSys *)this_02);
      (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
      (this_02->alloc0).parent = this_02;
      auVar20 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_02->alloc0).ptr = (char *)auVar20._0_8_;
      (this_02->alloc0).cur = auVar20._8_8_;
      (this_02->alloc0).end = auVar20._16_8_;
      (this_02->alloc0).allocBlockSize = auVar20._24_8_;
      (this_02->alloc0).end = auVar20._0_8_;
      (this_02->alloc0).allocBlockSize = auVar20._8_8_;
      (this_02->alloc0).bytesUsed = auVar20._16_8_;
      (this_02->alloc0).bytesWasted = auVar20._24_8_;
      (this_02->alloc1).parent = this_02;
      auVar20 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_02->alloc1).ptr = (char *)auVar20._0_8_;
      (this_02->alloc1).cur = auVar20._8_8_;
      (this_02->alloc1).end = auVar20._16_8_;
      (this_02->alloc1).allocBlockSize = auVar20._24_8_;
      (this_02->alloc1).end = auVar20._0_8_;
      (this_02->alloc1).allocBlockSize = auVar20._8_8_;
      (this_02->alloc1).bytesUsed = auVar20._16_8_;
      (this_02->alloc1).bytesWasted = auVar20._24_8_;
      *local_a8 = (long)this_02;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      local_a0.mutex = (MutexSys *)this_02;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&local_a0);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)&local_a0);
      Lock<embree::MutexSys>::~Lock(&lock);
    }
    this_00 = &pBVar7->alloc;
    uVar19 = (ulong)(((pBVar7->alloc).use_single_mode ^ 1) << 6);
    local_e0 = (MutexSys *)&DAT_00000010;
    this_01 = *(value_type *)((long)&(this_02->alloc0).parent + uVar19);
    if (this_00 != (this_01->alloc)._M_b._M_p) {
      local_a0.locked = true;
      local_a0.mutex = &this_01->mutex;
      MutexSys::lock(&this_01->mutex);
      if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((this_01->alloc0).end + (this_01->alloc1).end) -
             ((this_01->alloc0).cur + (this_01->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
        UNLOCK();
      }
      auVar20 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_01->alloc0).end = auVar20._0_8_;
      (this_01->alloc0).allocBlockSize = auVar20._8_8_;
      (this_01->alloc0).bytesUsed = auVar20._16_8_;
      (this_01->alloc0).bytesWasted = auVar20._24_8_;
      (this_01->alloc0).ptr = (char *)auVar20._0_8_;
      (this_01->alloc0).cur = auVar20._8_8_;
      (this_01->alloc0).end = auVar20._16_8_;
      (this_01->alloc0).allocBlockSize = auVar20._24_8_;
      (this_01->alloc0).allocBlockSize = (pBVar7->alloc).defaultBlockSize;
      auVar20 = ZEXT1632(ZEXT816(0) << 0x40);
      (this_01->alloc1).ptr = (char *)auVar20._0_8_;
      (this_01->alloc1).cur = auVar20._8_8_;
      (this_01->alloc1).end = auVar20._16_8_;
      (this_01->alloc1).allocBlockSize = auVar20._24_8_;
      (this_01->alloc1).end = auVar20._0_8_;
      (this_01->alloc1).allocBlockSize = auVar20._8_8_;
      (this_01->alloc1).bytesUsed = auVar20._16_8_;
      (this_01->alloc1).bytesWasted = auVar20._24_8_;
      (this_01->alloc1).allocBlockSize = (pBVar7->alloc).defaultBlockSize;
      LOCK();
      (this_01->alloc)._M_b._M_p = this_00;
      UNLOCK();
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      lock.locked = true;
      local_90 = this_01;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(pBVar7->alloc).thread_local_allocators,&local_90);
      Lock<embree::MutexSys>::~Lock(&lock);
      Lock<embree::MutexSys>::~Lock(&local_a0);
    }
    plVar2 = (long *)((long)&(this_02->alloc0).bytesUsed + uVar19);
    *plVar2 = (long)((long)&local_e0->mutex + *plVar2);
    lVar14 = *(long *)((long)&(this_02->alloc0).cur + uVar19);
    uVar15 = (ulong)(-(int)lVar14 & 0xf);
    puVar12 = (undefined1 *)((long)&local_e0->mutex + uVar15 + lVar14);
    *(undefined1 **)((long)&(this_02->alloc0).cur + uVar19) = puVar12;
    if (*(undefined1 **)((long)&(this_02->alloc0).end + uVar19) < puVar12) {
      *(long *)((long)&(this_02->alloc0).cur + uVar19) = lVar14;
      pMVar9 = *(MutexSys **)((long)&(this_02->alloc0).allocBlockSize + uVar19);
      if (pMVar9 < (MutexSys *)((long)local_e0 << 2)) {
        puVar13 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)&local_e0);
      }
      else {
        lock.mutex = pMVar9;
        puVar13 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)&lock);
        *(undefined8 **)((long)&(this_02->alloc0).ptr + uVar19) = puVar13;
        lVar14 = (*(long *)((long)&(this_02->alloc0).end + uVar19) -
                 *(long *)((long)&(this_02->alloc0).cur + uVar19)) +
                 *(long *)((long)&(this_02->alloc0).bytesWasted + uVar19);
        *(long *)((long)&(this_02->alloc0).bytesWasted + uVar19) = lVar14;
        *(undefined8 *)((long)&(this_02->alloc0).cur + uVar19) = 0;
        *(MutexSys **)((long)&(this_02->alloc0).end + uVar19) = lock.mutex;
        *(MutexSys **)((long)&(this_02->alloc0).cur + uVar19) = local_e0;
        if (lock.mutex < local_e0) {
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar19) = 0;
          lock.mutex = *(MutexSys **)((long)&(this_02->alloc0).allocBlockSize + uVar19);
          puVar13 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)&lock);
          *(undefined8 **)((long)&(this_02->alloc0).ptr + uVar19) = puVar13;
          lVar14 = (*(long *)((long)&(this_02->alloc0).end + uVar19) -
                   *(long *)((long)&(this_02->alloc0).cur + uVar19)) +
                   *(long *)((long)&(this_02->alloc0).bytesWasted + uVar19);
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar19) = lVar14;
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar19) = 0;
          *(MutexSys **)((long)&(this_02->alloc0).end + uVar19) = lock.mutex;
          *(MutexSys **)((long)&(this_02->alloc0).cur + uVar19) = local_e0;
          if (lock.mutex < local_e0) {
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar19) = 0;
            puVar13 = (undefined8 *)0x0;
            goto LAB_00dc7b35;
          }
        }
        *(long *)((long)&(this_02->alloc0).bytesWasted + uVar19) = lVar14;
      }
    }
    else {
      plVar2 = (long *)((long)&(this_02->alloc0).bytesWasted + uVar19);
      *plVar2 = *plVar2 + uVar15;
      puVar13 = (undefined8 *)
                (puVar12 + (*(long *)((long)&(this_02->alloc0).ptr + uVar19) - (long)local_e0));
    }
LAB_00dc7b35:
    uVar16 = uVar16 + 1;
    uVar5 = *(uint *)((long)&((local_d8.items)->lower).field_0 + lVar18);
    *puVar13 = (topBuilder->bvh->scene->geometries).items[uVar5].ptr;
    *(uint *)(puVar13 + 1) = uVar5;
    aVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx((undefined1  [16])
                           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                           field_0,ZEXT416((uint)local_b0->objectID_),0x30);
    LOCK();
    paVar3 = &topBuilder->nextRef;
    iVar4 = (paVar3->super___atomic_base<int>)._M_i;
    (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    aVar11 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx((undefined1  [16])
                           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                           field_0,ZEXT416(1),0x30);
    pBVar8 = (topBuilder->refs).items;
    pBVar8[iVar4].super_PrimRef.upper.field_0 = aVar11;
    pBVar8[iVar4].super_PrimRef.lower.field_0 = aVar10;
    pBVar8[iVar4].node.ptr = (ulong)puVar13 | 9;
    pBVar8[iVar4].bounds_area = 0.0;
    lVar18 = lVar18 + 0x20;
  } while( true );
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }